

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst_sse4.c
# Opt level: O0

int64_t av1_highbd_pixel_proj_error_sse4_1
                  (uint8_t *src8,int width,int height,int src_stride,uint8_t *dat8,int dat_stride,
                  int32_t *flt0,int flt0_stride,int32_t *flt1,int flt1_stride,int *xq,
                  sgr_params_type *params)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  int in_ECX;
  int in_EDX;
  ulong uVar29;
  long in_RSI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qa_03;
  undefined8 extraout_XMM0_Qa_04;
  undefined8 extraout_XMM0_Qa_05;
  undefined8 extraout_XMM0_Qa_06;
  undefined8 extraout_XMM0_Qa_07;
  undefined8 extraout_XMM0_Qa_08;
  undefined8 extraout_XMM0_Qa_09;
  undefined8 extraout_XMM0_Qa_10;
  undefined8 extraout_XMM0_Qa_11;
  undefined8 extraout_XMM0_Qa_12;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined8 extraout_XMM0_Qb_03;
  undefined8 extraout_XMM0_Qb_04;
  undefined8 extraout_XMM0_Qb_05;
  ulong extraout_XMM0_Qb_06;
  undefined8 extraout_XMM0_Qb_07;
  undefined8 extraout_XMM0_Qb_08;
  undefined8 extraout_XMM0_Qb_09;
  undefined8 extraout_XMM0_Qb_10;
  undefined8 extraout_XMM0_Qb_11;
  undefined8 extraout_XMM0_Qb_12;
  undefined1 auVar30 [16];
  __m128i alVar31;
  long in_stack_00000008;
  int in_stack_00000010;
  long in_stack_00000018;
  int64_t sum [2];
  int *in_stack_00000030;
  int32_t e_2;
  __m128i sum32h_2;
  __m128i sum32l_2;
  __m128i err1;
  __m128i err0_2;
  __m128i diff1;
  __m128i diff0;
  __m128i d1;
  __m128i d0_2;
  __m128i s1;
  __m128i s0_2;
  __m128i sum32_2;
  int32_t e_1;
  int32_t v_1;
  int32_t u_1;
  __m128i sum32h_1;
  __m128i sum32l_1;
  __m128i err0_1;
  __m128i e0_1;
  __m128i vr_1;
  __m128i vrl_1;
  __m128i vrh_1;
  __m128i vl_1;
  __m128i vh_1;
  __m128i d0l_xq;
  __m128i d0h_xq;
  __m128i fltl_xq;
  __m128i flth_xq;
  __m128i fltl;
  __m128i flth;
  __m128i d0l;
  __m128i d0h;
  __m128i d0_1;
  __m128i s0_1;
  __m128i sum32_1;
  int flt_stride;
  int32_t *flt;
  __m128i xq_inactive;
  __m128i xq_active;
  int32_t xq_on;
  int32_t e;
  int32_t v;
  int32_t u;
  __m128i sum32h;
  __m128i sum32l;
  __m128i err0;
  __m128i e0;
  __m128i vr;
  __m128i vrh;
  __m128i vrl;
  __m128i vh;
  __m128i vl;
  __m128i v1h;
  __m128i v1l;
  __m128i v0h;
  __m128i v0l;
  __m128i flt1h_subu;
  __m128i flt1l_subu;
  __m128i flt0h_subu;
  __m128i flt0l_subu;
  __m128i flt1h;
  __m128i flt1l;
  __m128i flt0h;
  __m128i flt0l;
  __m128i u0h;
  __m128i u0l;
  __m128i u0;
  __m128i d0;
  __m128i s0;
  __m128i sum32;
  __m128i xq1;
  __m128i xq0;
  int64_t err;
  uint16_t *dat;
  uint16_t *src;
  __m128i sum64;
  __m128i rounding;
  int32_t shift;
  int k;
  int j;
  int i;
  int local_c3c;
  long local_c38;
  int local_c2c;
  long local_c28;
  long local_c20;
  int local_c0c;
  undefined1 local_c08 [16];
  undefined1 local_bf8 [16];
  undefined1 local_be8 [16];
  undefined1 local_bd8 [16];
  short local_bc8;
  short sStack_bc6;
  short sStack_bc4;
  short sStack_bc2;
  short sStack_bc0;
  short sStack_bbe;
  short sStack_bbc;
  short sStack_bba;
  short local_bb8;
  short sStack_bb6;
  short sStack_bb4;
  short sStack_bb2;
  short sStack_bb0;
  short sStack_bae;
  short sStack_bac;
  short sStack_baa;
  undefined8 local_b98;
  undefined8 uStack_b90;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 local_b78;
  undefined8 uStack_b70;
  int local_b68;
  int iStack_b64;
  int iStack_b60;
  int iStack_b5c;
  int local_b54;
  int local_b50;
  int local_b4c;
  undefined1 local_b48 [16];
  undefined1 local_b38 [16];
  undefined1 local_b28 [16];
  short local_b18;
  short sStack_b16;
  short sStack_b14;
  short sStack_b12;
  short sStack_b10;
  short sStack_b0e;
  short sStack_b0c;
  short sStack_b0a;
  undefined1 local_b08 [16];
  int local_af8;
  int iStack_af4;
  int iStack_af0;
  int iStack_aec;
  int local_ae8;
  int iStack_ae4;
  int iStack_ae0;
  int iStack_adc;
  int local_ad8;
  int iStack_ad4;
  int iStack_ad0;
  int iStack_acc;
  int local_ac8;
  int iStack_ac4;
  int iStack_ac0;
  int iStack_abc;
  undefined1 local_ab8 [16];
  undefined1 local_aa8 [16];
  undefined1 local_a98 [16];
  undefined1 local_a88 [16];
  undefined8 local_a68;
  undefined8 uStack_a60;
  undefined1 local_a58 [16];
  undefined1 local_a48 [16];
  undefined8 local_a38;
  ulong uStack_a30;
  undefined8 local_a28;
  undefined8 uStack_a20;
  int local_a18;
  int iStack_a14;
  int iStack_a10;
  int iStack_a0c;
  int local_a04;
  long local_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  int local_9d8;
  int local_9d4;
  int local_9d0;
  int local_9cc;
  undefined1 local_9c8 [16];
  undefined1 local_9b8 [16];
  undefined1 local_9a8 [16];
  short local_998;
  short sStack_996;
  short sStack_994;
  short sStack_992;
  short sStack_990;
  short sStack_98e;
  short sStack_98c;
  short sStack_98a;
  undefined1 local_988 [16];
  int local_978;
  int iStack_974;
  int iStack_970;
  int iStack_96c;
  int local_968;
  int iStack_964;
  int iStack_960;
  int iStack_95c;
  int local_958;
  int iStack_954;
  int iStack_950;
  int iStack_94c;
  int local_948;
  int iStack_944;
  int iStack_940;
  int iStack_93c;
  undefined1 local_938 [16];
  undefined1 local_928 [16];
  undefined1 local_918 [16];
  undefined1 local_908 [16];
  int local_8f8;
  int iStack_8f4;
  int iStack_8f0;
  int iStack_8ec;
  int local_8e8;
  int iStack_8e4;
  int iStack_8e0;
  int iStack_8dc;
  int local_8d8;
  int iStack_8d4;
  int iStack_8d0;
  int iStack_8cc;
  int local_8c8;
  int iStack_8c4;
  int iStack_8c0;
  int iStack_8bc;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined1 local_878 [16];
  undefined1 local_868 [16];
  undefined1 local_858 [16];
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  int local_828;
  int iStack_824;
  int iStack_820;
  int iStack_81c;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  long local_7f0;
  long local_7e8;
  long local_7e0;
  long local_7d8;
  long lStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined4 local_7b4;
  int local_7b0;
  int local_7ac;
  int local_7a8;
  int local_7a4;
  int local_794;
  int local_790;
  int local_78c;
  uint local_77c;
  int local_778;
  uint local_774;
  undefined4 local_770;
  undefined4 local_76c;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined4 local_6dc;
  short local_6c8;
  short sStack_6c6;
  short sStack_6c4;
  short sStack_6c2;
  short sStack_6c0;
  short sStack_6be;
  short sStack_6bc;
  short sStack_6ba;
  short local_6b8;
  short sStack_6b6;
  short sStack_6b4;
  short sStack_6b2;
  short sStack_6b0;
  short sStack_6ae;
  short sStack_6ac;
  short sStack_6aa;
  short local_6a8;
  short sStack_6a6;
  short sStack_6a4;
  short sStack_6a2;
  short sStack_6a0;
  short sStack_69e;
  short sStack_69c;
  short sStack_69a;
  short local_698;
  short sStack_696;
  short sStack_694;
  short sStack_692;
  short sStack_690;
  short sStack_68e;
  short sStack_68c;
  short sStack_68a;
  short local_688;
  short sStack_686;
  short sStack_684;
  short sStack_682;
  short sStack_680;
  short sStack_67e;
  short sStack_67c;
  short sStack_67a;
  short local_678;
  short sStack_676;
  short sStack_674;
  short sStack_672;
  short sStack_670;
  short sStack_66e;
  short sStack_66c;
  short sStack_66a;
  short local_668;
  short sStack_666;
  short sStack_664;
  short sStack_662;
  short sStack_660;
  short sStack_65e;
  short sStack_65c;
  short sStack_65a;
  short local_658;
  short sStack_656;
  short sStack_654;
  short sStack_652;
  short sStack_650;
  short sStack_64e;
  short sStack_64c;
  short sStack_64a;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined4 local_5bc;
  int local_5b8;
  int iStack_5b4;
  int iStack_5b0;
  int iStack_5ac;
  undefined4 local_59c;
  int local_598;
  int iStack_594;
  int iStack_590;
  int iStack_58c;
  undefined4 local_57c;
  int local_578;
  int iStack_574;
  int iStack_570;
  int iStack_56c;
  undefined4 local_55c;
  int local_558;
  int iStack_554;
  int iStack_550;
  int iStack_54c;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  short local_3c8;
  short sStack_3c6;
  short sStack_3c4;
  short sStack_3c2;
  short sStack_3c0;
  short sStack_3be;
  short sStack_3bc;
  short sStack_3ba;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  short local_3a8;
  short sStack_3a6;
  short sStack_3a4;
  short sStack_3a2;
  short sStack_3a0;
  short sStack_39e;
  short sStack_39c;
  short sStack_39a;
  undefined8 local_398;
  undefined8 uStack_390;
  long local_388;
  long lStack_380;
  long local_378;
  long lStack_370;
  long local_368;
  long lStack_360;
  long local_358;
  long lStack_350;
  long local_348;
  long lStack_340;
  long local_338;
  long lStack_330;
  long local_328;
  long lStack_320;
  long local_318;
  long lStack_310;
  long local_308;
  long lStack_300;
  long local_2f8;
  long lStack_2f0;
  long local_2e8;
  long lStack_2e0;
  long local_2d8;
  long lStack_2d0;
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined8 local_288;
  undefined8 uStack_280;
  int local_278;
  int iStack_274;
  int iStack_270;
  int iStack_26c;
  undefined8 local_268;
  undefined8 uStack_260;
  int local_258;
  int iStack_254;
  int iStack_250;
  int iStack_24c;
  undefined8 local_248;
  undefined8 uStack_240;
  int local_238;
  int iStack_234;
  int iStack_230;
  int iStack_22c;
  undefined8 local_228;
  undefined8 uStack_220;
  int local_218;
  int iStack_214;
  int iStack_210;
  int iStack_20c;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined4 local_98;
  undefined4 local_94;
  undefined4 local_90;
  undefined4 local_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_70;
  undefined4 local_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  uint local_10;
  uint local_c;
  uint local_8;
  uint local_4;
  
  local_78c = (int)in_RSI;
  local_7b4 = 0xb;
  local_76c = 0x400;
  local_8c = 0x400;
  local_90 = 0x400;
  local_94 = 0x400;
  local_98 = 0x400;
  uVar29 = 0x400;
  local_7c8 = 0x40000000400;
  uStack_7c0 = 0x40000000400;
  local_738 = 0;
  uStack_730 = 0;
  local_7d8 = 0;
  lStack_7d0 = 0;
  local_7e0 = in_RDI << 1;
  local_7e8 = in_R8 << 1;
  local_7f0 = 0;
  local_7a4 = in_R9D;
  local_794 = in_ECX;
  local_790 = in_EDX;
  local_a8 = local_7c8;
  uStack_a0 = uStack_7c0;
  if ((*in_stack_00000030 < 1) || (in_stack_00000030[1] < 1)) {
    if ((*in_stack_00000030 < 1) && (in_stack_00000030[1] < 1)) {
      for (local_7a8 = 0; local_7a8 < local_790; local_7a8 = local_7a8 + 1) {
        local_768 = 0;
        uStack_760 = 0;
        local_b68 = 0;
        iStack_b64 = 0;
        iStack_b60 = 0;
        iStack_b5c = 0;
        for (local_7ac = 0; local_7ac <= local_78c + -0x10; local_7ac = local_7ac + 0x10) {
          xx_loadu_128((void *)(local_7e0 + (long)local_7ac * 2));
          local_b78 = extraout_XMM0_Qa_09;
          uStack_b70 = extraout_XMM0_Qb_09;
          xx_loadu_128((void *)(local_7e0 + (long)local_7ac * 2 + 0x10));
          local_b88 = extraout_XMM0_Qa_10;
          uStack_b80 = extraout_XMM0_Qb_10;
          xx_loadu_128((void *)(local_7e8 + (long)local_7ac * 2));
          local_b98 = extraout_XMM0_Qa_11;
          uStack_b90 = extraout_XMM0_Qb_11;
          alVar31 = xx_loadu_128((void *)(local_7e8 + (long)local_7ac * 2 + 0x10));
          uVar29 = alVar31[1];
          local_698 = (short)local_b98;
          sStack_696 = (short)((ulong)local_b98 >> 0x10);
          sStack_694 = (short)((ulong)local_b98 >> 0x20);
          sStack_692 = (short)((ulong)local_b98 >> 0x30);
          sStack_690 = (short)uStack_b90;
          sStack_68e = (short)((ulong)uStack_b90 >> 0x10);
          sStack_68c = (short)((ulong)uStack_b90 >> 0x20);
          sStack_68a = (short)((ulong)uStack_b90 >> 0x30);
          local_6a8 = (short)local_b78;
          sStack_6a6 = (short)((ulong)local_b78 >> 0x10);
          sStack_6a4 = (short)((ulong)local_b78 >> 0x20);
          sStack_6a2 = (short)((ulong)local_b78 >> 0x30);
          sStack_6a0 = (short)uStack_b70;
          sStack_69e = (short)((ulong)uStack_b70 >> 0x10);
          sStack_69c = (short)((ulong)uStack_b70 >> 0x20);
          sStack_69a = (short)((ulong)uStack_b70 >> 0x30);
          local_bb8 = local_698 - local_6a8;
          sStack_bb6 = sStack_696 - sStack_6a6;
          sStack_bb4 = sStack_694 - sStack_6a4;
          sStack_bb2 = sStack_692 - sStack_6a2;
          sStack_bb0 = sStack_690 - sStack_6a0;
          sStack_bae = sStack_68e - sStack_69e;
          sStack_bac = sStack_68c - sStack_69c;
          sStack_baa = sStack_68a - sStack_69a;
          local_6b8 = (short)extraout_XMM0_Qa_12;
          sStack_6b6 = (short)((ulong)extraout_XMM0_Qa_12 >> 0x10);
          sStack_6b4 = (short)((ulong)extraout_XMM0_Qa_12 >> 0x20);
          sStack_6b2 = (short)((ulong)extraout_XMM0_Qa_12 >> 0x30);
          sStack_6b0 = (short)extraout_XMM0_Qb_12;
          sStack_6ae = (short)((ulong)extraout_XMM0_Qb_12 >> 0x10);
          sStack_6ac = (short)((ulong)extraout_XMM0_Qb_12 >> 0x20);
          sStack_6aa = (short)((ulong)extraout_XMM0_Qb_12 >> 0x30);
          local_6c8 = (short)local_b88;
          sStack_6c6 = (short)((ulong)local_b88 >> 0x10);
          sStack_6c4 = (short)((ulong)local_b88 >> 0x20);
          sStack_6c2 = (short)((ulong)local_b88 >> 0x30);
          sStack_6c0 = (short)uStack_b80;
          sStack_6be = (short)((ulong)uStack_b80 >> 0x10);
          sStack_6bc = (short)((ulong)uStack_b80 >> 0x20);
          sStack_6ba = (short)((ulong)uStack_b80 >> 0x30);
          local_bc8 = local_6b8 - local_6c8;
          sStack_bc6 = sStack_6b6 - sStack_6c6;
          sStack_bc4 = sStack_6b4 - sStack_6c4;
          sStack_bc2 = sStack_6b2 - sStack_6c2;
          sStack_bc0 = sStack_6b0 - sStack_6c0;
          sStack_bbe = sStack_6ae - sStack_6be;
          sStack_bbc = sStack_6ac - sStack_6bc;
          sStack_bba = sStack_6aa - sStack_6ba;
          local_618 = CONCAT26(sStack_bb2,CONCAT24(sStack_bb4,CONCAT22(sStack_bb6,local_bb8)));
          uStack_610 = CONCAT26(sStack_baa,CONCAT24(sStack_bac,CONCAT22(sStack_bae,sStack_bb0)));
          local_628 = CONCAT26(sStack_bb2,CONCAT24(sStack_bb4,CONCAT22(sStack_bb6,local_bb8)));
          uStack_620 = CONCAT26(sStack_baa,CONCAT24(sStack_bac,CONCAT22(sStack_bae,sStack_bb0)));
          auVar10._8_8_ = uStack_610;
          auVar10._0_8_ = local_618;
          auVar9._8_8_ = uStack_620;
          auVar9._0_8_ = local_628;
          local_bd8 = pmaddwd(auVar10,auVar9);
          local_638 = CONCAT26(sStack_bc2,CONCAT24(sStack_bc4,CONCAT22(sStack_bc6,local_bc8)));
          uStack_630 = CONCAT26(sStack_bba,CONCAT24(sStack_bbc,CONCAT22(sStack_bbe,sStack_bc0)));
          local_648 = CONCAT26(sStack_bc2,CONCAT24(sStack_bc4,CONCAT22(sStack_bc6,local_bc8)));
          uStack_640 = CONCAT26(sStack_bba,CONCAT24(sStack_bbc,CONCAT22(sStack_bbe,sStack_bc0)));
          auVar8._8_8_ = uStack_630;
          auVar8._0_8_ = local_638;
          auVar7._8_8_ = uStack_640;
          auVar7._0_8_ = local_648;
          local_be8 = pmaddwd(auVar8,auVar7);
          local_518 = CONCAT44(iStack_b64,local_b68);
          uStack_510 = CONCAT44(iStack_b5c,iStack_b60);
          local_528._0_4_ = local_bd8._0_4_;
          local_528._4_4_ = local_bd8._4_4_;
          uStack_520._0_4_ = local_bd8._8_4_;
          uStack_520._4_4_ = local_bd8._12_4_;
          local_538 = CONCAT44(iStack_b64 + local_528._4_4_,local_b68 + (int)local_528);
          uStack_530 = CONCAT44(iStack_b5c + uStack_520._4_4_,iStack_b60 + (int)uStack_520);
          local_548._0_4_ = local_be8._0_4_;
          local_548._4_4_ = local_be8._4_4_;
          uStack_540._0_4_ = local_be8._8_4_;
          uStack_540._4_4_ = local_be8._12_4_;
          local_b68 = local_b68 + (int)local_528 + (int)local_548;
          iStack_b64 = iStack_b64 + local_528._4_4_ + local_548._4_4_;
          iStack_b60 = iStack_b60 + (int)uStack_520 + (int)uStack_540;
          iStack_b5c = iStack_b5c + uStack_520._4_4_ + uStack_540._4_4_;
          local_548 = local_be8._0_8_;
          uStack_540 = local_be8._8_8_;
          local_528 = local_bd8._0_8_;
          uStack_520 = local_bd8._8_8_;
        }
        local_f8._8_4_ = iStack_b60;
        local_f8._0_8_ = CONCAT44(iStack_b64,local_b68);
        local_f8._12_4_ = iStack_b5c;
        local_bf8 = pmovzxdq(local_f8,CONCAT44(iStack_b64,local_b68));
        local_358 = local_7d8;
        lStack_350 = lStack_7d0;
        local_368 = local_bf8._0_8_;
        lStack_360 = local_bf8._8_8_;
        local_378 = local_7d8 + local_bf8._0_8_;
        lStack_370 = lStack_7d0 + local_bf8._8_8_;
        local_108._8_8_ = 0;
        local_108._0_8_ = CONCAT44(iStack_b5c,iStack_b60);
        local_c08 = pmovzxdq(local_108,CONCAT44(iStack_b5c,iStack_b60));
        local_388 = local_c08._0_8_;
        lStack_380 = local_c08._8_8_;
        local_7d8 = local_378 + local_c08._0_8_;
        lStack_7d0 = lStack_370 + local_c08._8_8_;
        for (local_7b0 = local_7ac; local_7b0 < local_78c; local_7b0 = local_7b0 + 1) {
          uVar29 = (ulong)local_7b0;
          local_c0c = (uint)*(ushort *)(local_7e8 + (long)local_7b0 * 2) -
                      (uint)*(ushort *)(local_7e0 + uVar29 * 2);
          local_7f0 = (long)local_c0c * (long)local_c0c + local_7f0;
        }
        local_7e8 = local_7e8 + (long)local_7a4 * 2;
        local_7e0 = local_7e0 + (long)local_794 * 2;
      }
    }
    else {
      if (*in_stack_00000030 < 1) {
        local_c2c = *(int *)(sum[1] + 4);
      }
      else {
        local_c2c = *(int *)sum[1];
      }
      local_9d8 = local_c2c;
      local_778 = local_c2c;
      local_2c = local_c2c;
      local_30 = local_c2c;
      local_34 = local_c2c;
      local_38 = local_c2c;
      local_9e8 = CONCAT44(local_c2c,local_c2c);
      uStack_9e0 = CONCAT44(local_c2c,local_c2c);
      local_77c = local_c2c * -0x10;
      uVar29 = (ulong)local_77c;
      local_9f8 = CONCAT44(local_77c,local_77c);
      uStack_9f0 = CONCAT44(local_77c,local_77c);
      if (*in_stack_00000030 < 1) {
        local_c38 = in_stack_00000018;
      }
      else {
        local_c38 = in_stack_00000008;
      }
      local_a00 = local_c38;
      if (*in_stack_00000030 < 1) {
        local_c3c = (int)sum[0];
      }
      else {
        local_c3c = in_stack_00000010;
      }
      local_a04 = local_c3c;
      local_48 = local_9e8;
      uStack_40 = uStack_9e0;
      local_28 = local_9f8;
      uStack_20 = uStack_9f0;
      local_10 = local_77c;
      local_c = local_77c;
      local_8 = local_77c;
      local_4 = local_77c;
      for (local_7a8 = 0; local_7a8 < local_790; local_7a8 = local_7a8 + 1) {
        local_758 = 0;
        uStack_750 = 0;
        local_a18 = 0;
        iStack_a14 = 0;
        iStack_a10 = 0;
        iStack_a0c = 0;
        for (local_7ac = 0; local_7ac <= local_78c + -8; local_7ac = local_7ac + 8) {
          xx_loadu_128((void *)(local_7e0 + (long)local_7ac * 2));
          local_a28 = extraout_XMM0_Qa_05;
          uStack_a20 = extraout_XMM0_Qb_05;
          xx_loadu_128((void *)(local_7e8 + (long)local_7ac * 2));
          local_2b8._8_8_ = 0;
          local_2b8._0_8_ = extraout_XMM0_Qb_06;
          local_a48 = pmovzxwd(local_2b8,extraout_XMM0_Qb_06);
          auVar30._8_8_ = extraout_XMM0_Qb_06;
          auVar30._0_8_ = extraout_XMM0_Qa_06;
          local_a58 = pmovzxwd(auVar30,extraout_XMM0_Qa_06);
          local_a38 = extraout_XMM0_Qa_06;
          uStack_a30 = extraout_XMM0_Qb_06;
          xx_loadu_128((void *)(local_a00 + (long)local_7ac * 4 + 0x10));
          local_a68 = extraout_XMM0_Qa_07;
          uStack_a60 = extraout_XMM0_Qb_07;
          alVar31 = xx_loadu_128((void *)(local_a00 + (long)local_7ac * 4));
          uVar29 = alVar31[1];
          local_1a8 = local_9e8;
          uStack_1a0 = uStack_9e0;
          auVar20._8_8_ = uStack_a60;
          auVar20._0_8_ = local_a68;
          auVar19._8_8_ = uStack_9e0;
          auVar19._0_8_ = local_9e8;
          local_a88 = pmulld(auVar20,auVar19);
          local_1c8 = local_9e8;
          uStack_1c0 = uStack_9e0;
          auVar18._8_8_ = extraout_XMM0_Qb_08;
          auVar18._0_8_ = extraout_XMM0_Qa_08;
          auVar17._8_8_ = uStack_9e0;
          auVar17._0_8_ = local_9e8;
          local_a98 = pmulld(auVar18,auVar17);
          local_1d8 = local_a48._0_8_;
          uStack_1d0 = local_a48._8_8_;
          local_1e8 = local_9f8;
          uStack_1e0 = uStack_9f0;
          auVar16._8_8_ = uStack_9f0;
          auVar16._0_8_ = local_9f8;
          local_aa8 = pmulld(local_a48,auVar16);
          local_1f8 = local_a58._0_8_;
          uStack_1f0 = local_a58._8_8_;
          local_208 = local_9f8;
          uStack_200 = uStack_9f0;
          auVar15._8_8_ = uStack_9f0;
          auVar15._0_8_ = local_9f8;
          local_ab8 = pmulld(local_a58,auVar15);
          local_478._0_4_ = local_a88._0_4_;
          local_478._4_4_ = local_a88._4_4_;
          uStack_470._0_4_ = local_a88._8_4_;
          uStack_470._4_4_ = local_a88._12_4_;
          local_488._0_4_ = local_aa8._0_4_;
          local_488._4_4_ = local_aa8._4_4_;
          uStack_480._0_4_ = local_aa8._8_4_;
          uStack_480._4_4_ = local_aa8._12_4_;
          local_ac8 = (int)local_478 + (int)local_488;
          iStack_ac4 = local_478._4_4_ + local_488._4_4_;
          iStack_ac0 = (int)uStack_470 + (int)uStack_480;
          iStack_abc = uStack_470._4_4_ + uStack_480._4_4_;
          local_498._0_4_ = local_a98._0_4_;
          local_498._4_4_ = local_a98._4_4_;
          uStack_490._0_4_ = local_a98._8_4_;
          uStack_490._4_4_ = local_a98._12_4_;
          local_4a8._0_4_ = local_ab8._0_4_;
          local_4a8._4_4_ = local_ab8._4_4_;
          uStack_4a0._0_4_ = local_ab8._8_4_;
          uStack_4a0._4_4_ = local_ab8._12_4_;
          local_ad8 = (int)local_498 + (int)local_4a8;
          iStack_ad4 = local_498._4_4_ + local_4a8._4_4_;
          iStack_ad0 = (int)uStack_490 + (int)uStack_4a0;
          iStack_acc = uStack_490._4_4_ + uStack_4a0._4_4_;
          local_4b8 = CONCAT44(iStack_ac4,local_ac8);
          uStack_4b0 = CONCAT44(iStack_abc,iStack_ac0);
          local_4c8._0_4_ = (int)local_7c8;
          local_4c8._4_4_ = (int)((ulong)local_7c8 >> 0x20);
          uStack_4c0._0_4_ = (int)uStack_7c0;
          uStack_4c0._4_4_ = (int)((ulong)uStack_7c0 >> 0x20);
          local_598 = local_ac8 + (int)local_4c8;
          iStack_594 = iStack_ac4 + local_4c8._4_4_;
          iStack_590 = iStack_ac0 + (int)uStack_4c0;
          iStack_58c = iStack_abc + uStack_4c0._4_4_;
          local_59c = 0xb;
          auVar30 = ZEXT416(0xb);
          local_ae8 = local_598 >> auVar30;
          iStack_ae4 = iStack_594 >> auVar30;
          iStack_ae0 = iStack_590 >> auVar30;
          iStack_adc = iStack_58c >> auVar30;
          local_4d8 = CONCAT44(iStack_ad4,local_ad8);
          uStack_4d0 = CONCAT44(iStack_acc,iStack_ad0);
          local_4e8 = local_7c8;
          uStack_4e0 = uStack_7c0;
          local_5b8 = local_ad8 + (int)local_4c8;
          iStack_5b4 = iStack_ad4 + local_4c8._4_4_;
          iStack_5b0 = iStack_ad0 + (int)uStack_4c0;
          iStack_5ac = iStack_acc + uStack_4c0._4_4_;
          local_5bc = 0xb;
          auVar30 = ZEXT416(0xb);
          local_af8 = local_5b8 >> auVar30;
          iStack_af4 = iStack_5b4 >> auVar30;
          iStack_af0 = iStack_5b0 >> auVar30;
          iStack_aec = iStack_5ac >> auVar30;
          local_718 = CONCAT44(iStack_af4,local_af8);
          uStack_710 = CONCAT44(iStack_aec,iStack_af0);
          local_728 = CONCAT44(iStack_ae4,local_ae8);
          uStack_720 = CONCAT44(iStack_adc,iStack_ae0);
          auVar3._8_8_ = uStack_710;
          auVar3._0_8_ = local_718;
          auVar2._8_8_ = uStack_720;
          auVar2._0_8_ = local_728;
          local_b08 = packssdw(auVar3,auVar2);
          local_3b8._0_2_ = local_b08._0_2_;
          local_3b8._2_2_ = local_b08._2_2_;
          local_3b8._4_2_ = local_b08._4_2_;
          local_3b8._6_2_ = local_b08._6_2_;
          uStack_3b0._0_2_ = local_b08._8_2_;
          uStack_3b0._2_2_ = local_b08._10_2_;
          uStack_3b0._4_2_ = local_b08._12_2_;
          uStack_3b0._6_2_ = local_b08._14_2_;
          local_3c8 = (short)local_a38;
          sStack_3c6 = (short)((ulong)local_a38 >> 0x10);
          sStack_3c4 = (short)((ulong)local_a38 >> 0x20);
          sStack_3c2 = (short)((ulong)local_a38 >> 0x30);
          sStack_3c0 = (short)uStack_a30;
          sStack_3be = (short)(uStack_a30 >> 0x10);
          sStack_3bc = (short)(uStack_a30 >> 0x20);
          sStack_3ba = (short)(uStack_a30 >> 0x30);
          local_678 = (short)local_3b8 + local_3c8;
          sStack_676 = local_3b8._2_2_ + sStack_3c6;
          sStack_674 = local_3b8._4_2_ + sStack_3c4;
          sStack_672 = local_3b8._6_2_ + sStack_3c2;
          sStack_670 = (short)uStack_3b0 + sStack_3c0;
          sStack_66e = uStack_3b0._2_2_ + sStack_3be;
          sStack_66c = uStack_3b0._4_2_ + sStack_3bc;
          sStack_66a = uStack_3b0._6_2_ + sStack_3ba;
          local_688 = (short)local_a28;
          sStack_686 = (short)((ulong)local_a28 >> 0x10);
          sStack_684 = (short)((ulong)local_a28 >> 0x20);
          sStack_682 = (short)((ulong)local_a28 >> 0x30);
          sStack_680 = (short)uStack_a20;
          sStack_67e = (short)((ulong)uStack_a20 >> 0x10);
          sStack_67c = (short)((ulong)uStack_a20 >> 0x20);
          sStack_67a = (short)((ulong)uStack_a20 >> 0x30);
          local_b18 = local_678 - local_688;
          sStack_b16 = sStack_676 - sStack_686;
          sStack_b14 = sStack_674 - sStack_684;
          sStack_b12 = sStack_672 - sStack_682;
          sStack_b10 = sStack_670 - sStack_680;
          sStack_b0e = sStack_66e - sStack_67e;
          sStack_b0c = sStack_66c - sStack_67c;
          sStack_b0a = sStack_66a - sStack_67a;
          local_5f8 = CONCAT26(sStack_b12,CONCAT24(sStack_b14,CONCAT22(sStack_b16,local_b18)));
          uStack_5f0 = CONCAT26(sStack_b0a,CONCAT24(sStack_b0c,CONCAT22(sStack_b0e,sStack_b10)));
          local_608 = CONCAT26(sStack_b12,CONCAT24(sStack_b14,CONCAT22(sStack_b16,local_b18)));
          uStack_600 = CONCAT26(sStack_b0a,CONCAT24(sStack_b0c,CONCAT22(sStack_b0e,sStack_b10)));
          auVar12._8_8_ = uStack_5f0;
          auVar12._0_8_ = local_5f8;
          auVar11._8_8_ = uStack_600;
          auVar11._0_8_ = local_608;
          local_b28 = pmaddwd(auVar12,auVar11);
          local_4f8 = CONCAT44(iStack_a14,local_a18);
          uStack_4f0 = CONCAT44(iStack_a0c,iStack_a10);
          local_508._0_4_ = local_b28._0_4_;
          local_508._4_4_ = local_b28._4_4_;
          uStack_500._0_4_ = local_b28._8_4_;
          uStack_500._4_4_ = local_b28._12_4_;
          local_a18 = local_a18 + (int)local_508;
          iStack_a14 = iStack_a14 + local_508._4_4_;
          iStack_a10 = iStack_a10 + (int)uStack_500;
          iStack_a0c = iStack_a0c + uStack_500._4_4_;
          local_508 = local_b28._0_8_;
          uStack_500 = local_b28._8_8_;
          local_4c8 = local_7c8;
          uStack_4c0 = uStack_7c0;
          local_4a8 = local_ab8._0_8_;
          uStack_4a0 = local_ab8._8_8_;
          local_498 = local_a98._0_8_;
          uStack_490 = local_a98._8_8_;
          local_488 = local_aa8._0_8_;
          uStack_480 = local_aa8._8_8_;
          local_478 = local_a88._0_8_;
          uStack_470 = local_a88._8_8_;
          local_3b8 = local_b08._0_8_;
          uStack_3b0 = local_b08._8_8_;
        }
        local_d8._8_4_ = iStack_a10;
        local_d8._0_8_ = CONCAT44(iStack_a14,local_a18);
        local_d8._12_4_ = iStack_a0c;
        local_b38 = pmovzxdq(local_d8,CONCAT44(iStack_a14,local_a18));
        local_318 = local_7d8;
        lStack_310 = lStack_7d0;
        local_328 = local_b38._0_8_;
        lStack_320 = local_b38._8_8_;
        local_338 = local_7d8 + local_b38._0_8_;
        lStack_330 = lStack_7d0 + local_b38._8_8_;
        local_e8._8_8_ = 0;
        local_e8._0_8_ = CONCAT44(iStack_a0c,iStack_a10);
        local_b48 = pmovzxdq(local_e8,CONCAT44(iStack_a0c,iStack_a10));
        local_348 = local_b48._0_8_;
        lStack_340 = local_b48._8_8_;
        local_7d8 = local_338 + local_b48._0_8_;
        lStack_7d0 = lStack_330 + local_b48._8_8_;
        for (local_7b0 = local_7ac; local_7b0 < local_78c; local_7b0 = local_7b0 + 1) {
          uVar1 = (uint)*(ushort *)(local_7e8 + (long)local_7b0 * 2);
          local_b4c = uVar1 * 0x10;
          local_b50 = local_9d8 * (*(int *)(local_a00 + (long)local_7b0 * 4) + uVar1 * -0x10);
          uVar29 = (ulong)local_7b0;
          local_b54 = ((local_b50 + 0x400 >> 0xb) +
                      (uint)*(ushort *)(local_7e8 + (long)local_7b0 * 2)) -
                      (uint)*(ushort *)(local_7e0 + uVar29 * 2);
          local_7f0 = (long)local_b54 * (long)local_b54 + local_7f0;
        }
        local_7e8 = local_7e8 + (long)local_7a4 * 2;
        local_7e0 = local_7e0 + (long)local_794 * 2;
        local_a00 = local_a00 + (long)local_a04 * 4;
      }
    }
  }
  else {
    local_770 = *(undefined4 *)sum[1];
    local_808 = CONCAT44(local_770,local_770);
    uStack_800 = CONCAT44(local_770,local_770);
    local_774 = *(uint *)(sum[1] + 4);
    uVar29 = (ulong)local_774;
    local_818 = CONCAT44(local_774,local_774);
    uStack_810 = CONCAT44(local_774,local_774);
    local_88 = local_808;
    uStack_80 = uStack_800;
    local_78 = local_770;
    local_74 = local_770;
    local_70 = local_770;
    local_6c = local_770;
    local_68 = local_818;
    uStack_60 = uStack_810;
    local_58 = local_774;
    local_54 = local_774;
    local_50 = local_774;
    local_4c = local_774;
    for (local_7a8 = 0; local_7a8 < local_790; local_7a8 = local_7a8 + 1) {
      local_748 = 0;
      uStack_740 = 0;
      local_828 = 0;
      iStack_824 = 0;
      iStack_820 = 0;
      iStack_81c = 0;
      for (local_7ac = 0; local_7ac <= local_78c + -8; local_7ac = local_7ac + 8) {
        xx_loadu_128((void *)(local_7e0 + (long)local_7ac * 2));
        local_838 = extraout_XMM0_Qa;
        uStack_830 = extraout_XMM0_Qb;
        xx_loadu_128((void *)(local_7e8 + (long)local_7ac * 2));
        local_6dc = 4;
        auVar6._8_8_ = extraout_XMM0_Qb_00;
        auVar6._0_8_ = extraout_XMM0_Qa_00;
        local_858 = psllw(auVar6,ZEXT416(4));
        local_298._0_8_ = local_858._0_8_;
        local_868 = pmovzxwd(local_858,local_298._0_8_);
        local_2a8._0_8_ = local_858._8_8_;
        local_878 = pmovzxwd(local_858 >> 0x40,local_2a8._0_8_);
        local_848 = extraout_XMM0_Qa_00;
        uStack_840 = extraout_XMM0_Qb_00;
        local_2a8 = local_858 >> 0x40;
        local_298 = local_858;
        xx_loadu_128((void *)(in_stack_00000008 + (long)local_7ac * 4));
        local_888 = extraout_XMM0_Qa_01;
        uStack_880 = extraout_XMM0_Qb_01;
        xx_loadu_128((void *)(in_stack_00000008 + (long)local_7ac * 4 + 0x10));
        local_898 = extraout_XMM0_Qa_02;
        uStack_890 = extraout_XMM0_Qb_02;
        xx_loadu_128((void *)(in_stack_00000018 + (long)local_7ac * 4));
        local_8a8 = extraout_XMM0_Qa_03;
        uStack_8a0 = extraout_XMM0_Qb_03;
        alVar31 = xx_loadu_128((void *)(in_stack_00000018 + (long)local_7ac * 4 + 0x10));
        uVar29 = alVar31[1];
        local_218 = (int)local_888;
        iStack_214 = (int)((ulong)local_888 >> 0x20);
        iStack_210 = (int)uStack_880;
        iStack_20c = (int)((ulong)uStack_880 >> 0x20);
        local_228._0_4_ = local_868._0_4_;
        local_228._4_4_ = local_868._4_4_;
        uStack_220._0_4_ = local_868._8_4_;
        uStack_220._4_4_ = local_868._12_4_;
        local_8c8 = local_218 - (int)local_228;
        iStack_8c4 = iStack_214 - local_228._4_4_;
        iStack_8c0 = iStack_210 - (int)uStack_220;
        iStack_8bc = iStack_20c - uStack_220._4_4_;
        local_238 = (int)local_898;
        iStack_234 = (int)((ulong)local_898 >> 0x20);
        iStack_230 = (int)uStack_890;
        iStack_22c = (int)((ulong)uStack_890 >> 0x20);
        local_248._0_4_ = local_878._0_4_;
        local_248._4_4_ = local_878._4_4_;
        uStack_240._0_4_ = local_878._8_4_;
        uStack_240._4_4_ = local_878._12_4_;
        local_8d8 = local_238 - (int)local_248;
        iStack_8d4 = iStack_234 - local_248._4_4_;
        iStack_8d0 = iStack_230 - (int)uStack_240;
        iStack_8cc = iStack_22c - uStack_240._4_4_;
        local_268 = local_868._0_8_;
        uStack_260 = local_868._8_8_;
        local_258 = (int)local_8a8;
        iStack_254 = (int)((ulong)local_8a8 >> 0x20);
        iStack_250 = (int)uStack_8a0;
        iStack_24c = (int)((ulong)uStack_8a0 >> 0x20);
        local_8e8 = local_258 - (int)local_228;
        iStack_8e4 = iStack_254 - local_228._4_4_;
        iStack_8e0 = iStack_250 - (int)uStack_220;
        iStack_8dc = iStack_24c - uStack_220._4_4_;
        local_288 = local_878._0_8_;
        uStack_280 = local_878._8_8_;
        local_278 = (int)extraout_XMM0_Qa_04;
        iStack_274 = (int)((ulong)extraout_XMM0_Qa_04 >> 0x20);
        iStack_270 = (int)extraout_XMM0_Qb_04;
        iStack_26c = (int)((ulong)extraout_XMM0_Qb_04 >> 0x20);
        local_8f8 = local_278 - (int)local_248;
        iStack_8f4 = iStack_274 - local_248._4_4_;
        iStack_8f0 = iStack_270 - (int)uStack_240;
        iStack_8ec = iStack_26c - uStack_240._4_4_;
        local_118 = CONCAT44(iStack_8c4,local_8c8);
        uStack_110 = CONCAT44(iStack_8bc,iStack_8c0);
        local_128 = local_808;
        uStack_120 = uStack_800;
        auVar28._8_8_ = uStack_110;
        auVar28._0_8_ = local_118;
        auVar27._8_8_ = uStack_800;
        auVar27._0_8_ = local_808;
        local_908 = pmulld(auVar28,auVar27);
        local_138 = CONCAT44(iStack_8d4,local_8d8);
        uStack_130 = CONCAT44(iStack_8cc,iStack_8d0);
        local_148 = local_808;
        uStack_140 = uStack_800;
        auVar26._8_8_ = uStack_130;
        auVar26._0_8_ = local_138;
        auVar25._8_8_ = uStack_800;
        auVar25._0_8_ = local_808;
        local_918 = pmulld(auVar26,auVar25);
        local_158 = CONCAT44(iStack_8e4,local_8e8);
        uStack_150 = CONCAT44(iStack_8dc,iStack_8e0);
        local_168 = local_818;
        uStack_160 = uStack_810;
        auVar24._8_8_ = uStack_150;
        auVar24._0_8_ = local_158;
        auVar23._8_8_ = uStack_810;
        auVar23._0_8_ = local_818;
        local_928 = pmulld(auVar24,auVar23);
        local_178 = CONCAT44(iStack_8f4,local_8f8);
        uStack_170 = CONCAT44(iStack_8ec,iStack_8f0);
        local_188 = local_818;
        uStack_180 = uStack_810;
        auVar22._8_8_ = uStack_170;
        auVar22._0_8_ = local_178;
        auVar21._8_8_ = uStack_810;
        auVar21._0_8_ = local_818;
        local_938 = pmulld(auVar22,auVar21);
        local_3d8._0_4_ = local_908._0_4_;
        local_3d8._4_4_ = local_908._4_4_;
        uStack_3d0._0_4_ = local_908._8_4_;
        uStack_3d0._4_4_ = local_908._12_4_;
        local_3e8._0_4_ = local_928._0_4_;
        local_3e8._4_4_ = local_928._4_4_;
        uStack_3e0._0_4_ = local_928._8_4_;
        uStack_3e0._4_4_ = local_928._12_4_;
        local_948 = (int)local_3d8 + (int)local_3e8;
        iStack_944 = local_3d8._4_4_ + local_3e8._4_4_;
        iStack_940 = (int)uStack_3d0 + (int)uStack_3e0;
        iStack_93c = uStack_3d0._4_4_ + uStack_3e0._4_4_;
        local_3f8._0_4_ = local_918._0_4_;
        local_3f8._4_4_ = local_918._4_4_;
        uStack_3f0._0_4_ = local_918._8_4_;
        uStack_3f0._4_4_ = local_918._12_4_;
        local_408._0_4_ = local_938._0_4_;
        local_408._4_4_ = local_938._4_4_;
        uStack_400._0_4_ = local_938._8_4_;
        uStack_400._4_4_ = local_938._12_4_;
        local_958 = (int)local_3f8 + (int)local_408;
        iStack_954 = local_3f8._4_4_ + local_408._4_4_;
        iStack_950 = (int)uStack_3f0 + (int)uStack_400;
        iStack_94c = uStack_3f0._4_4_ + uStack_400._4_4_;
        local_418 = CONCAT44(iStack_944,local_948);
        uStack_410 = CONCAT44(iStack_93c,iStack_940);
        local_428._0_4_ = (int)local_7c8;
        local_428._4_4_ = (int)((ulong)local_7c8 >> 0x20);
        uStack_420._0_4_ = (int)uStack_7c0;
        uStack_420._4_4_ = (int)((ulong)uStack_7c0 >> 0x20);
        local_558 = local_948 + (int)local_428;
        iStack_554 = iStack_944 + local_428._4_4_;
        iStack_550 = iStack_940 + (int)uStack_420;
        iStack_54c = iStack_93c + uStack_420._4_4_;
        local_55c = 0xb;
        auVar30 = ZEXT416(0xb);
        local_968 = local_558 >> auVar30;
        iStack_964 = iStack_554 >> auVar30;
        iStack_960 = iStack_550 >> auVar30;
        iStack_95c = iStack_54c >> auVar30;
        local_438 = CONCAT44(iStack_954,local_958);
        uStack_430 = CONCAT44(iStack_94c,iStack_950);
        local_448 = local_7c8;
        uStack_440 = uStack_7c0;
        local_578 = local_958 + (int)local_428;
        iStack_574 = iStack_954 + local_428._4_4_;
        iStack_570 = iStack_950 + (int)uStack_420;
        iStack_56c = iStack_94c + uStack_420._4_4_;
        local_57c = 0xb;
        auVar30 = ZEXT416(0xb);
        local_978 = local_578 >> auVar30;
        iStack_974 = iStack_574 >> auVar30;
        iStack_970 = iStack_570 >> auVar30;
        iStack_96c = iStack_56c >> auVar30;
        local_6f8 = CONCAT44(iStack_964,local_968);
        uStack_6f0 = CONCAT44(iStack_95c,iStack_960);
        local_708 = CONCAT44(iStack_974,local_978);
        uStack_700 = CONCAT44(iStack_96c,iStack_970);
        auVar5._8_8_ = uStack_6f0;
        auVar5._0_8_ = local_6f8;
        auVar4._8_8_ = uStack_700;
        auVar4._0_8_ = local_708;
        local_988 = packssdw(auVar5,auVar4);
        local_398._0_2_ = local_988._0_2_;
        local_398._2_2_ = local_988._2_2_;
        local_398._4_2_ = local_988._4_2_;
        local_398._6_2_ = local_988._6_2_;
        uStack_390._0_2_ = local_988._8_2_;
        uStack_390._2_2_ = local_988._10_2_;
        uStack_390._4_2_ = local_988._12_2_;
        uStack_390._6_2_ = local_988._14_2_;
        local_3a8 = (short)local_848;
        sStack_3a6 = (short)((ulong)local_848 >> 0x10);
        sStack_3a4 = (short)((ulong)local_848 >> 0x20);
        sStack_3a2 = (short)((ulong)local_848 >> 0x30);
        sStack_3a0 = (short)uStack_840;
        sStack_39e = (short)((ulong)uStack_840 >> 0x10);
        sStack_39c = (short)((ulong)uStack_840 >> 0x20);
        sStack_39a = (short)((ulong)uStack_840 >> 0x30);
        local_658 = (short)local_398 + local_3a8;
        sStack_656 = local_398._2_2_ + sStack_3a6;
        sStack_654 = local_398._4_2_ + sStack_3a4;
        sStack_652 = local_398._6_2_ + sStack_3a2;
        sStack_650 = (short)uStack_390 + sStack_3a0;
        sStack_64e = uStack_390._2_2_ + sStack_39e;
        sStack_64c = uStack_390._4_2_ + sStack_39c;
        sStack_64a = uStack_390._6_2_ + sStack_39a;
        local_668 = (short)local_838;
        sStack_666 = (short)((ulong)local_838 >> 0x10);
        sStack_664 = (short)((ulong)local_838 >> 0x20);
        sStack_662 = (short)((ulong)local_838 >> 0x30);
        sStack_660 = (short)uStack_830;
        sStack_65e = (short)((ulong)uStack_830 >> 0x10);
        sStack_65c = (short)((ulong)uStack_830 >> 0x20);
        sStack_65a = (short)((ulong)uStack_830 >> 0x30);
        local_998 = local_658 - local_668;
        sStack_996 = sStack_656 - sStack_666;
        sStack_994 = sStack_654 - sStack_664;
        sStack_992 = sStack_652 - sStack_662;
        sStack_990 = sStack_650 - sStack_660;
        sStack_98e = sStack_64e - sStack_65e;
        sStack_98c = sStack_64c - sStack_65c;
        sStack_98a = sStack_64a - sStack_65a;
        local_5d8 = CONCAT26(sStack_992,CONCAT24(sStack_994,CONCAT22(sStack_996,local_998)));
        uStack_5d0 = CONCAT26(sStack_98a,CONCAT24(sStack_98c,CONCAT22(sStack_98e,sStack_990)));
        local_5e8 = CONCAT26(sStack_992,CONCAT24(sStack_994,CONCAT22(sStack_996,local_998)));
        uStack_5e0 = CONCAT26(sStack_98a,CONCAT24(sStack_98c,CONCAT22(sStack_98e,sStack_990)));
        auVar14._8_8_ = uStack_5d0;
        auVar14._0_8_ = local_5d8;
        auVar13._8_8_ = uStack_5e0;
        auVar13._0_8_ = local_5e8;
        local_9a8 = pmaddwd(auVar14,auVar13);
        local_458 = CONCAT44(iStack_824,local_828);
        uStack_450 = CONCAT44(iStack_81c,iStack_820);
        local_468._0_4_ = local_9a8._0_4_;
        local_468._4_4_ = local_9a8._4_4_;
        uStack_460._0_4_ = local_9a8._8_4_;
        uStack_460._4_4_ = local_9a8._12_4_;
        local_828 = local_828 + (int)local_468;
        iStack_824 = iStack_824 + local_468._4_4_;
        iStack_820 = iStack_820 + (int)uStack_460;
        iStack_81c = iStack_81c + uStack_460._4_4_;
        local_468 = local_9a8._0_8_;
        uStack_460 = local_9a8._8_8_;
        local_428 = local_7c8;
        uStack_420 = uStack_7c0;
        local_408 = local_938._0_8_;
        uStack_400 = local_938._8_8_;
        local_3f8 = local_918._0_8_;
        uStack_3f0 = local_918._8_8_;
        local_3e8 = local_928._0_8_;
        uStack_3e0 = local_928._8_8_;
        local_3d8 = local_908._0_8_;
        uStack_3d0 = local_908._8_8_;
        local_398 = local_988._0_8_;
        uStack_390 = local_988._8_8_;
        local_248 = local_878._0_8_;
        uStack_240 = local_878._8_8_;
        local_228 = local_868._0_8_;
        uStack_220 = local_868._8_8_;
      }
      local_b8._8_4_ = iStack_820;
      local_b8._0_8_ = CONCAT44(iStack_824,local_828);
      local_b8._12_4_ = iStack_81c;
      local_9b8 = pmovzxdq(local_b8,CONCAT44(iStack_824,local_828));
      local_2d8 = local_7d8;
      lStack_2d0 = lStack_7d0;
      local_2e8 = local_9b8._0_8_;
      lStack_2e0 = local_9b8._8_8_;
      local_2f8 = local_7d8 + local_9b8._0_8_;
      lStack_2f0 = lStack_7d0 + local_9b8._8_8_;
      local_c8._8_8_ = 0;
      local_c8._0_8_ = CONCAT44(iStack_81c,iStack_820);
      local_9c8 = pmovzxdq(local_c8,CONCAT44(iStack_81c,iStack_820));
      local_308 = local_9c8._0_8_;
      lStack_300 = local_9c8._8_8_;
      local_7d8 = local_2f8 + local_9c8._0_8_;
      lStack_7d0 = lStack_2f0 + local_9c8._8_8_;
      for (local_7b0 = local_7ac; local_7b0 < local_78c; local_7b0 = local_7b0 + 1) {
        uVar1 = (uint)*(ushort *)(local_7e8 + (long)local_7b0 * 2);
        local_9cc = uVar1 * 0x10;
        in_RSI = (long)local_7b0;
        local_9d0 = *(int *)sum[1] *
                    (*(int *)(in_stack_00000008 + (long)local_7b0 * 4) + uVar1 * -0x10) +
                    *(int *)(sum[1] + 4) *
                    (*(int *)(in_stack_00000018 + in_RSI * 4) + uVar1 * -0x10);
        uVar29 = (ulong)local_7b0;
        local_9d4 = ((local_9d0 + 0x400 >> 0xb) + (uint)*(ushort *)(local_7e8 + (long)local_7b0 * 2)
                    ) - (uint)*(ushort *)(local_7e0 + uVar29 * 2);
        local_7f0 = (long)local_9d4 * (long)local_9d4 + local_7f0;
      }
      local_7e8 = local_7e8 + (long)local_7a4 * 2;
      local_7e0 = local_7e0 + (long)local_794 * 2;
      in_stack_00000008 = in_stack_00000008 + (long)in_stack_00000010 * 4;
      in_stack_00000018 = in_stack_00000018 + (long)(int)sum[0] * 4;
    }
  }
  alVar31[1] = uVar29;
  alVar31[0] = in_RSI;
  xx_storeu_128(&local_c28,alVar31);
  return local_c28 + local_c20 + local_7f0;
}

Assistant:

int64_t av1_highbd_pixel_proj_error_sse4_1(
    const uint8_t *src8, int width, int height, int src_stride,
    const uint8_t *dat8, int dat_stride, int32_t *flt0, int flt0_stride,
    int32_t *flt1, int flt1_stride, int xq[2], const sgr_params_type *params) {
  int i, j, k;
  const int32_t shift = SGRPROJ_RST_BITS + SGRPROJ_PRJ_BITS;
  const __m128i rounding = _mm_set1_epi32(1 << (shift - 1));
  __m128i sum64 = _mm_setzero_si128();
  const uint16_t *src = CONVERT_TO_SHORTPTR(src8);
  const uint16_t *dat = CONVERT_TO_SHORTPTR(dat8);
  int64_t err = 0;
  if (params->r[0] > 0 && params->r[1] > 0) {  // Both filters are enabled
    const __m128i xq0 = _mm_set1_epi32(xq[0]);
    const __m128i xq1 = _mm_set1_epi32(xq[1]);

    for (i = 0; i < height; ++i) {
      __m128i sum32 = _mm_setzero_si128();
      for (j = 0; j <= width - 8; j += 8) {
        // Load 8x pixels from source image
        const __m128i s0 = xx_loadu_128(src + j);
        // s0 = [7 6 5 4 3 2 1 0] as i16 (indices of src[])

        // Load 8x pixels from corrupted image
        const __m128i d0 = xx_loadu_128(dat + j);
        // d0 = [7 6 5 4 3 2 1 0] as i16 (indices of dat[])

        // Shift each pixel value up by SGRPROJ_RST_BITS
        const __m128i u0 = _mm_slli_epi16(d0, SGRPROJ_RST_BITS);

        // Split u0 into two halves and pad each from u16 to i32
        const __m128i u0l = _mm_cvtepu16_epi32(u0);
        const __m128i u0h = _mm_cvtepu16_epi32(_mm_srli_si128(u0, 8));
        // u0h = [7 6 5 4] as i32, u0l = [3 2 1 0] as i32, all dat[] indices

        // Load 8 pixels from first and second filtered images
        const __m128i flt0l = xx_loadu_128(flt0 + j);
        const __m128i flt0h = xx_loadu_128(flt0 + j + 4);
        const __m128i flt1l = xx_loadu_128(flt1 + j);
        const __m128i flt1h = xx_loadu_128(flt1 + j + 4);
        // flt0 = [7 6 5 4] [3 2 1 0] as i32 (indices of flt0+j)
        // flt1 = [7 6 5 4] [3 2 1 0] as i32 (indices of flt1+j)

        // Subtract shifted corrupt image from each filtered image
        // This gives our two basis vectors for the projection
        const __m128i flt0l_subu = _mm_sub_epi32(flt0l, u0l);
        const __m128i flt0h_subu = _mm_sub_epi32(flt0h, u0h);
        const __m128i flt1l_subu = _mm_sub_epi32(flt1l, u0l);
        const __m128i flt1h_subu = _mm_sub_epi32(flt1h, u0h);
        // flt?h_subu = [ f[7]-u[7] f[6]-u[6] f[5]-u[5] f[4]-u[4] ] as i32
        // flt?l_subu = [ f[3]-u[3] f[2]-u[2] f[1]-u[1] f[0]-u[0] ] as i32

        // Multiply each basis vector by the corresponding coefficient
        const __m128i v0l = _mm_mullo_epi32(flt0l_subu, xq0);
        const __m128i v0h = _mm_mullo_epi32(flt0h_subu, xq0);
        const __m128i v1l = _mm_mullo_epi32(flt1l_subu, xq1);
        const __m128i v1h = _mm_mullo_epi32(flt1h_subu, xq1);

        // Add together the contribution from each scaled basis vector
        const __m128i vl = _mm_add_epi32(v0l, v1l);
        const __m128i vh = _mm_add_epi32(v0h, v1h);

        // Right-shift v with appropriate rounding
        const __m128i vrl = _mm_srai_epi32(_mm_add_epi32(vl, rounding), shift);
        const __m128i vrh = _mm_srai_epi32(_mm_add_epi32(vh, rounding), shift);

        // Saturate each i32 value to i16 and combine lower and upper halves
        const __m128i vr = _mm_packs_epi32(vrl, vrh);

        // Add twin-subspace-sgr-filter to corrupt image then subtract source
        const __m128i e0 = _mm_sub_epi16(_mm_add_epi16(vr, d0), s0);

        // Calculate squared error and add adjacent values
        const __m128i err0 = _mm_madd_epi16(e0, e0);

        sum32 = _mm_add_epi32(sum32, err0);
      }

      const __m128i sum32l = _mm_cvtepu32_epi64(sum32);
      sum64 = _mm_add_epi64(sum64, sum32l);
      const __m128i sum32h = _mm_cvtepu32_epi64(_mm_srli_si128(sum32, 8));
      sum64 = _mm_add_epi64(sum64, sum32h);

      // Process remaining pixels in this row (modulo 8)
      for (k = j; k < width; ++k) {
        const int32_t u = (int32_t)(dat[k] << SGRPROJ_RST_BITS);
        int32_t v = xq[0] * (flt0[k] - u) + xq[1] * (flt1[k] - u);
        const int32_t e = ROUND_POWER_OF_TWO(v, shift) + dat[k] - src[k];
        err += ((int64_t)e * e);
      }
      dat += dat_stride;
      src += src_stride;
      flt0 += flt0_stride;
      flt1 += flt1_stride;
    }
  } else if (params->r[0] > 0 || params->r[1] > 0) {  // Only one filter enabled
    const int32_t xq_on = (params->r[0] > 0) ? xq[0] : xq[1];
    const __m128i xq_active = _mm_set1_epi32(xq_on);
    const __m128i xq_inactive =
        _mm_set1_epi32(-xq_on * (1 << SGRPROJ_RST_BITS));
    const int32_t *flt = (params->r[0] > 0) ? flt0 : flt1;
    const int flt_stride = (params->r[0] > 0) ? flt0_stride : flt1_stride;
    for (i = 0; i < height; ++i) {
      __m128i sum32 = _mm_setzero_si128();
      for (j = 0; j <= width - 8; j += 8) {
        // Load 8x pixels from source image
        const __m128i s0 = xx_loadu_128(src + j);
        // s0 = [7 6 5 4 3 2 1 0] as u16 (indices of src[])

        // Load 8x pixels from corrupted image and pad each u16 to i32
        const __m128i d0 = xx_loadu_128(dat + j);
        const __m128i d0h = _mm_cvtepu16_epi32(_mm_srli_si128(d0, 8));
        const __m128i d0l = _mm_cvtepu16_epi32(d0);
        // d0h, d0l = [7 6 5 4], [3 2 1 0] as u32 (indices of dat[])

        // Load 8 pixels from the filtered image
        const __m128i flth = xx_loadu_128(flt + j + 4);
        const __m128i fltl = xx_loadu_128(flt + j);
        // flth, fltl = [7 6 5 4], [3 2 1 0] as i32 (indices of flt+j)

        const __m128i flth_xq = _mm_mullo_epi32(flth, xq_active);
        const __m128i fltl_xq = _mm_mullo_epi32(fltl, xq_active);
        const __m128i d0h_xq = _mm_mullo_epi32(d0h, xq_inactive);
        const __m128i d0l_xq = _mm_mullo_epi32(d0l, xq_inactive);

        const __m128i vh = _mm_add_epi32(flth_xq, d0h_xq);
        const __m128i vl = _mm_add_epi32(fltl_xq, d0l_xq);
        // vh = [ xq0(f[7]-d[7]) xq0(f[6]-d[6]) xq0(f[5]-d[5]) xq0(f[4]-d[4]) ]
        // vl = [ xq0(f[3]-d[3]) xq0(f[2]-d[2]) xq0(f[1]-d[1]) xq0(f[0]-d[0]) ]

        // Shift this down with appropriate rounding
        const __m128i vrh = _mm_srai_epi32(_mm_add_epi32(vh, rounding), shift);
        const __m128i vrl = _mm_srai_epi32(_mm_add_epi32(vl, rounding), shift);

        // Saturate vr0 and vr1 from i32 to i16 then pack together
        const __m128i vr = _mm_packs_epi32(vrl, vrh);

        // Subtract twin-subspace-sgr filtered from source image to get error
        const __m128i e0 = _mm_sub_epi16(_mm_add_epi16(vr, d0), s0);

        // Calculate squared error and add adjacent values
        const __m128i err0 = _mm_madd_epi16(e0, e0);

        sum32 = _mm_add_epi32(sum32, err0);
      }

      const __m128i sum32l = _mm_cvtepu32_epi64(sum32);
      sum64 = _mm_add_epi64(sum64, sum32l);
      const __m128i sum32h = _mm_cvtepu32_epi64(_mm_srli_si128(sum32, 8));
      sum64 = _mm_add_epi64(sum64, sum32h);

      // Process remaining pixels in this row (modulo 8)
      for (k = j; k < width; ++k) {
        const int32_t u = (int32_t)(dat[k] << SGRPROJ_RST_BITS);
        int32_t v = xq_on * (flt[k] - u);
        const int32_t e = ROUND_POWER_OF_TWO(v, shift) + dat[k] - src[k];
        err += ((int64_t)e * e);
      }
      dat += dat_stride;
      src += src_stride;
      flt += flt_stride;
    }
  } else {  // Neither filter is enabled
    for (i = 0; i < height; ++i) {
      __m128i sum32 = _mm_setzero_si128();
      for (j = 0; j <= width - 16; j += 16) {
        // Load 2x8 u16 from source image
        const __m128i s0 = xx_loadu_128(src + j);
        const __m128i s1 = xx_loadu_128(src + j + 8);
        // Load 2x8 u16 from corrupted image
        const __m128i d0 = xx_loadu_128(dat + j);
        const __m128i d1 = xx_loadu_128(dat + j + 8);

        // Subtract corrupted image from source image
        const __m128i diff0 = _mm_sub_epi16(d0, s0);
        const __m128i diff1 = _mm_sub_epi16(d1, s1);

        // Square error and add adjacent values
        const __m128i err0 = _mm_madd_epi16(diff0, diff0);
        const __m128i err1 = _mm_madd_epi16(diff1, diff1);

        sum32 = _mm_add_epi32(sum32, err0);
        sum32 = _mm_add_epi32(sum32, err1);
      }

      const __m128i sum32l = _mm_cvtepu32_epi64(sum32);
      sum64 = _mm_add_epi64(sum64, sum32l);
      const __m128i sum32h = _mm_cvtepu32_epi64(_mm_srli_si128(sum32, 8));
      sum64 = _mm_add_epi64(sum64, sum32h);

      // Process remaining pixels (modulu 8)
      for (k = j; k < width; ++k) {
        const int32_t e = (int32_t)(dat[k]) - src[k];
        err += ((int64_t)e * e);
      }
      dat += dat_stride;
      src += src_stride;
    }
  }

  // Sum 4 values from sum64l and sum64h into err
  int64_t sum[2];
  xx_storeu_128(sum, sum64);
  err += sum[0] + sum[1];
  return err;
}